

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbf.cpp
# Opt level: O0

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
PaysForRBF_abi_cxx11_
          (CAmount original_fees,CAmount replacement_fees,size_t replacement_vsize,
          CFeeRate relay_fee,uint256 *txid)

{
  long lVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  CAmount CVar3;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *this;
  CAmount in_RCX;
  long in_RDX;
  long in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  long in_FS_OFFSET;
  CAmount additional_fees;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe80;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffe88;
  uint32_t num_bytes;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffea8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffeb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  char *in_stack_fffffffffffffeb8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RDX < in_RSI) {
    base_blob<256u>::ToString_abi_cxx11_((base_blob<256U> *)in_stack_fffffffffffffe80);
    FormatMoney_abi_cxx11_(in_RCX);
    FormatMoney_abi_cxx11_(in_RCX);
    tinyformat::format<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
              (in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,in_RDI)
    ;
    std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              (in_stack_fffffffffffffe88,in_stack_fffffffffffffe80);
    std::__cxx11::string::~string(in_stack_fffffffffffffe78);
    std::__cxx11::string::~string(in_stack_fffffffffffffe78);
    std::__cxx11::string::~string(in_stack_fffffffffffffe78);
    std::__cxx11::string::~string(in_stack_fffffffffffffe78);
    args_2 = in_RDI;
  }
  else {
    pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RDX - in_RSI);
    args_2 = in_RDI;
    args = pbVar2;
    CVar3 = CFeeRate::GetFee((CFeeRate *)in_RDI,(uint32_t)((ulong)pbVar2 >> 0x20));
    if ((long)pbVar2 < CVar3) {
      base_blob<256u>::ToString_abi_cxx11_((base_blob<256U> *)in_stack_fffffffffffffe80);
      num_bytes = (uint32_t)((ulong)pbVar2 >> 0x20);
      FormatMoney_abi_cxx11_(in_RCX);
      this = (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)CFeeRate::GetFee((CFeeRate *)in_RDI,num_bytes);
      FormatMoney_abi_cxx11_(in_RCX);
      tinyformat::format<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                (in_stack_fffffffffffffeb8,args,in_stack_fffffffffffffea8,args_2);
      std::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                (this,in_stack_fffffffffffffe80);
      std::__cxx11::string::~string(in_stack_fffffffffffffe78);
      std::__cxx11::string::~string(in_stack_fffffffffffffe78);
      std::__cxx11::string::~string(in_stack_fffffffffffffe78);
      std::__cxx11::string::~string(in_stack_fffffffffffffe78);
    }
    else {
      std::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      optional((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)in_RDI);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)args_2;
  }
  __stack_chk_fail();
}

Assistant:

std::optional<std::string> PaysForRBF(CAmount original_fees,
                                      CAmount replacement_fees,
                                      size_t replacement_vsize,
                                      CFeeRate relay_fee,
                                      const uint256& txid)
{
    // Rule #3: The replacement fees must be greater than or equal to fees of the
    // transactions it replaces, otherwise the bandwidth used by those conflicting transactions
    // would not be paid for.
    if (replacement_fees < original_fees) {
        return strprintf("rejecting replacement %s, less fees than conflicting txs; %s < %s",
                         txid.ToString(), FormatMoney(replacement_fees), FormatMoney(original_fees));
    }

    // Rule #4: The new transaction must pay for its own bandwidth. Otherwise, we have a DoS
    // vector where attackers can cause a transaction to be replaced (and relayed) repeatedly by
    // increasing the fee by tiny amounts.
    CAmount additional_fees = replacement_fees - original_fees;
    if (additional_fees < relay_fee.GetFee(replacement_vsize)) {
        return strprintf("rejecting replacement %s, not enough additional fees to relay; %s < %s",
                         txid.ToString(),
                         FormatMoney(additional_fees),
                         FormatMoney(relay_fee.GetFee(replacement_vsize)));
    }
    return std::nullopt;
}